

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O3

void __thiscall pstack::Procman::Process::~Process(Process *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Context *pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  this->_vptr_Process = (_func_int **)&PTR_findRDebugAddr_0013f720;
  local_20 = (this->vdsoImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  pCVar2 = this->context;
  local_18 = (this->vdsoImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  pstack::Context::flush(pCVar2,&local_20);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  td_ta_delete(this->agent);
  p_Var3 = (this->io).super___shared_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar4 = (this->abiPrefix)._M_dataplus._M_p;
  paVar1 = &(this->abiPrefix).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  p_Var3 = (this->vdsoImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->execImage).super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_pstack::Procman::MappedObject>,_std::_Select1st<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstack::Procman::MappedObject>_>_>
  ::~_Rb_tree(&(this->objects)._M_t);
  return;
}

Assistant:

Process::~Process()
{
    // don't leave the VDSO in the cache - a new copy will be entered for a new
    // process.
    context.flush(vdsoImage);
    td_ta_delete(agent);
}